

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O2

Literal * __thiscall
wasm::Literal::replaceLaneI32x4
          (Literal *__return_storage_ptr__,Literal *this,Literal *other,uint8_t index)

{
  reference this_00;
  undefined3 in_register_00000009;
  undefined1 local_88 [8];
  LaneArray<4> lanes;
  
  getLanes<int,4>((LaneArray<4> *)local_88,(wasm *)this,other);
  this_00 = std::array<wasm::Literal,_4UL>::at
                      ((LaneArray<4> *)local_88,(ulong)CONCAT31(in_register_00000009,index));
  if (this_00 != other) {
    ~Literal(this_00);
    Literal(this_00,other);
  }
  Literal(__return_storage_ptr__,(LaneArray<4> *)local_88);
  std::array<wasm::Literal,_4UL>::~array((array<wasm::Literal,_4UL> *)local_88);
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::replaceLaneI32x4(const Literal& other, uint8_t index) const {
  return replace<4, &Literal::getLanesI32x4>(*this, other, index);
}